

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plurrule.cpp
# Opt level: O2

RuleChain * __thiscall
icu_63::PluralRules::rulesForKeyword(PluralRules *this,UnicodeString *keyword)

{
  RuleChain *pRVar1;
  UBool UVar2;
  RuleChain **ppRVar3;
  
  ppRVar3 = &this->mRules;
  while( true ) {
    pRVar1 = *ppRVar3;
    if (pRVar1 == (RuleChain *)0x0) {
      return (RuleChain *)0x0;
    }
    UVar2 = UnicodeString::operator==(&pRVar1->fKeyword,keyword);
    if (UVar2 != '\0') break;
    ppRVar3 = &pRVar1->fNext;
  }
  return pRVar1;
}

Assistant:

RuleChain *PluralRules::rulesForKeyword(const UnicodeString &keyword) const {
    RuleChain *rc;
    for (rc = mRules; rc != nullptr; rc = rc->fNext) {
        if (rc->fKeyword == keyword) {
            break;
        }
    }
    return rc;
}